

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O2

char * ssh_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,Conf *conf,
               char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  Ssh *ssh;
  Conf *pCVar4;
  char *pcVar5;
  Socket *pSVar6;
  SockAddr *addr;
  BinaryPacketProtocol *pBVar7;
  char *loghost;
  
  ssh = (Ssh *)safemalloc(1,0x200,0);
  memset(ssh,0,0x200);
  pCVar4 = conf_copy(conf);
  ssh->conf = pCVar4;
  ssh_cache_conf_values(ssh);
  ssh->exitcode = -1;
  (ssh->pls).kctx = SSH2_PKTCTX_NOKEX;
  (ssh->pls).actx = SSH2_PKTCTX_NOAUTH;
  bufchain_init(&ssh->in_raw);
  bufchain_init(&ssh->out_raw);
  bufchain_init(&ssh->user_input);
  (ssh->ic_out_raw).fn = ssh_bpp_output_raw_data_callback;
  (ssh->ic_out_raw).ctx = ssh;
  iVar3 = conf_get_int(ssh->conf,0x7d);
  ssh->term_width = iVar3;
  iVar3 = conf_get_int(ssh->conf,0x7e);
  ssh->term_height = iVar3;
  (ssh->backend).vt = vt;
  (ssh->interactor).vt = &Ssh_interactorvt;
  (ssh->backend).interactor = &ssh->interactor;
  *backend_handle = &ssh->backend;
  ssh->bare_connection = vt->protocol == 4;
  ssh->seat = seat;
  (ssh->cl_dummy).vt = &dummy_connlayer_vtable;
  ssh->logctx = logctx;
  (ssh->cl_dummy).logctx = logctx;
  ssh_hostport_setup(host,port,ssh->conf,&ssh->savedhost,&ssh->savedport,&loghost);
  pcVar5 = default_description(vt,ssh->savedhost,ssh->savedport);
  ssh->description = pcVar5;
  random_ref();
  ssh->need_random_unref = true;
  (ssh->plug).vt = &Ssh_plugvt;
  ssh->connshare = (ssh_sharing_state *)0x0;
  ssh->attempting_connshare = true;
  pSVar6 = ssh_connection_sharing_init
                     (ssh->savedhost,ssh->savedport,ssh->conf,ssh->logctx,&ssh->plug,&ssh->connshare
                     );
  ssh->s = pSVar6;
  if (ssh->connshare != (ssh_sharing_state *)0x0) {
    ssh_connshare_provide_connlayer(ssh->connshare,&ssh->cl_dummy);
    pSVar6 = ssh->s;
  }
  ssh->attempting_connshare = false;
  if (pSVar6 == (Socket *)0x0) {
    iVar3 = conf_get_int(ssh->conf,3);
    addr = name_lookup(host,port,realhost,ssh->conf,iVar3,ssh->logctx,"SSH connection");
    pcVar5 = sk_addr_error(addr);
    if (pcVar5 != (char *)0x0) {
      sk_addr_free(addr);
LAB_001150ed:
      pcVar5 = dupstr(pcVar5);
      if (pcVar5 == (char *)0x0) {
        return (char *)0x0;
      }
      ssh->need_random_unref = false;
      random_unref();
      return pcVar5;
    }
    pcVar5 = dupstr(*realhost);
    ssh->fullhostname = pcVar5;
    pSVar6 = new_connection(addr,*realhost,port,false,true,nodelay,keepalive,&ssh->plug,ssh->conf,
                            &ssh->interactor);
    ssh->s = pSVar6;
    pcVar5 = (*pSVar6->vt->socket_error)(pSVar6);
    if (pcVar5 != (char *)0x0) {
      ssh->s = (Socket *)0x0;
      (*ssh->seat->vt->notify_remote_exit)(ssh->seat);
      (*ssh->seat->vt->notify_remote_disconnect)(ssh->seat);
      goto LAB_001150ed;
    }
  }
  else {
    ssh->bare_connection = true;
    ssh->fullhostname = (char *)0x0;
    pcVar5 = dupstr(host);
    *realhost = pcVar5;
    _Var1 = (*ssh->seat->vt->verbose)(ssh->seat);
    if ((_Var1) || (_Var1 = (*ssh->seat->vt->interactive)(ssh->seat), _Var1)) {
      (*ssh->seat->vt->output)
                (ssh->seat,SEAT_OUTPUT_STDERR,"Reusing a shared connection to this server.\r\n",0x2d
                );
    }
  }
  iVar3 = conf_get_int(ssh->conf,0x23);
  if (iVar3 == 0) {
    ssh->version = 1;
    bVar2 = 1;
    if (ssh->bare_connection != true) {
      pcVar5 = "1.5";
      bVar2 = 0;
      goto LAB_00115001;
    }
  }
  else {
    if (iVar3 != 3) {
      __assert_fail("sshprot == 0 || sshprot == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/ssh.c",
                    0x346,
                    "char *connect_to_host(Ssh *, const char *, int, char *, char **, _Bool, _Bool)"
                   );
    }
    bVar2 = ssh->bare_connection;
  }
  ssh->version = 2;
  pcVar5 = "2.0";
LAB_00115001:
  (ssh->version_receiver).got_ssh_version = ssh_got_ssh_version;
  pBVar7 = ssh_verstring_new(ssh->conf,ssh->logctx,(_Bool)(bVar2 & 1),pcVar5,&ssh->version_receiver,
                             false,"PuTTY");
  ssh->bpp = pBVar7;
  ssh_connect_bpp(ssh);
  queue_idempotent_callback(&ssh->bpp->ic_in_raw);
  if (*loghost != '\0') {
    safefree(*realhost);
    pcVar5 = dupstr(loghost);
    *realhost = pcVar5;
    return (char *)0x0;
  }
  return (char *)0x0;
}

Assistant:

static char *ssh_init(const BackendVtable *vt, Seat *seat,
                      Backend **backend_handle, LogContext *logctx,
                      Conf *conf, const char *host, int port,
                      char **realhost, bool nodelay, bool keepalive)
{
    Ssh *ssh;

    ssh = snew(Ssh);
    memset(ssh, 0, sizeof(Ssh));

    ssh->conf = conf_copy(conf);
    ssh_cache_conf_values(ssh);
    ssh->exitcode = -1;
    ssh->pls.kctx = SSH2_PKTCTX_NOKEX;
    ssh->pls.actx = SSH2_PKTCTX_NOAUTH;
    bufchain_init(&ssh->in_raw);
    bufchain_init(&ssh->out_raw);
    bufchain_init(&ssh->user_input);
    ssh->ic_out_raw.fn = ssh_bpp_output_raw_data_callback;
    ssh->ic_out_raw.ctx = ssh;

    ssh->term_width = conf_get_int(ssh->conf, CONF_width);
    ssh->term_height = conf_get_int(ssh->conf, CONF_height);

    ssh->backend.vt = vt;
    ssh->interactor.vt = &Ssh_interactorvt;
    ssh->backend.interactor = &ssh->interactor;
    *backend_handle = &ssh->backend;

    ssh->bare_connection = (vt->protocol == PROT_SSHCONN);

    ssh->seat = seat;
    ssh->cl_dummy.vt = &dummy_connlayer_vtable;
    ssh->cl_dummy.logctx = ssh->logctx = logctx;

    char *loghost;

    ssh_hostport_setup(host, port, ssh->conf,
                       &ssh->savedhost, &ssh->savedport, &loghost);
    ssh->description = default_description(vt, ssh->savedhost, ssh->savedport);

    random_ref(); /* do this now - may be needed by sharing setup code */
    ssh->need_random_unref = true;

    char *conn_err = connect_to_host(
        ssh, host, port, loghost, realhost, nodelay, keepalive);
    if (conn_err) {
        /* Call random_unref now instead of waiting until the caller
         * frees this useless Ssh object, in case the caller is
         * impatient and just exits without bothering, in which case
         * the random seed won't be re-saved. */
        ssh->need_random_unref = false;
        random_unref();
        return conn_err;
    }

    return NULL;
}